

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::StripPrefix
                   (string *__return_storage_ptr__,string *filepath,string *prefix_to_remove)

{
  int iVar1;
  char *__s1;
  char *__s2;
  size_t __n;
  string *prefix_to_remove_local;
  string *filepath_local;
  
  __s1 = (char *)std::__cxx11::string::c_str();
  __s2 = (char *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  iVar1 = strncmp(__s1,__s2,__n);
  if (iVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripPrefix(const std::string &filepath,
                        const std::string &prefix_to_remove) {
  if (!strncmp(filepath.c_str(), prefix_to_remove.c_str(),
               prefix_to_remove.size())) {
    return filepath.substr(prefix_to_remove.size());
  }
  return filepath;
}